

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

void __thiscall CConnman::ThreadI2PAcceptIncoming(CConnman *this)

{
  CService *this_00;
  CThreadInterrupt *this_01;
  bool bVar1;
  bool bVar2;
  long lVar3;
  long in_FS_OFFSET;
  Connection conn;
  direct_or_indirect local_150;
  uint local_140;
  Network local_138;
  uint32_t uStack_134;
  uint16_t local_130;
  direct_or_indirect local_128;
  uint local_118;
  Network local_110;
  uint32_t uStack_10c;
  uint16_t local_108;
  undefined8 local_100;
  undefined8 local_f8;
  direct_or_indirect local_f0;
  uint local_e0;
  Network local_d8;
  uint32_t uStack_d4;
  uint16_t local_d0;
  direct_or_indirect local_c8;
  uint local_b8;
  Network local_b0;
  uint32_t uStack_ac;
  uint16_t local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  Connection local_90;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &local_90.me;
  local_90.sock._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
  super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.super__Head_base<0UL,_Sock_*,_false>.
  _M_head_impl = (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)
                 (__uniq_ptr_impl<Sock,_std::default_delete<Sock>_>)0x0;
  CService::CService(this_00);
  CService::CService(&local_90.peer);
  this_01 = &this->interruptNet;
  lVar3 = 1;
  bVar1 = false;
LAB_008df27c:
  do {
    bVar2 = CThreadInterrupt::operator_cast_to_bool(this_01);
    if (bVar2) {
      if (0x10 < local_90.peer.super_CNetAddr.m_addr._size) {
        free(local_90.peer.super_CNetAddr.m_addr._union.indirect_contents.indirect);
        local_90.peer.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
      }
      if (0x10 < local_90.me.super_CNetAddr.m_addr._size) {
        free(local_90.me.super_CNetAddr.m_addr._union.indirect_contents.indirect);
        local_90.me.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
      }
      if (local_90.sock._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
          super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
          super__Head_base<0UL,_Sock_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<Sock,_std::default_delete<Sock>_>)0x0) {
        (**(code **)(*(long *)local_90.sock._M_t.
                              super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
                              super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
                              super__Head_base<0UL,_Sock_*,_false>._M_head_impl + 8))();
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
    bVar2 = i2p::sam::Session::Listen
                      ((this->m_i2p_sam_session)._M_t.
                       super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>
                       .super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl,&local_90);
    if (bVar2) {
      if (!bVar1) {
        bVar1 = true;
        AddLocal(this_00,4);
      }
      bVar2 = i2p::sam::Session::Accept
                        ((this->m_i2p_sam_session)._M_t.
                         super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>
                         .super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl,&local_90);
      if (bVar2) {
        prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                  ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_f0.indirect_contents,
                   (prevector<16U,_unsigned_char,_unsigned_int,_int> *)this_00);
        local_d8 = local_90.me.super_CNetAddr.m_net;
        uStack_d4 = local_90.me.super_CNetAddr.m_scope_id;
        local_d0 = local_90.me.port;
        prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                  ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_c8.indirect_contents,
                   (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_f0.indirect_contents);
        local_b0 = local_d8;
        uStack_ac = uStack_d4;
        local_a8 = local_d0;
        local_a0 = 100000000;
        local_98 = 0;
        prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                  ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_150.indirect_contents,
                   (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_90.peer);
        local_138 = local_90.peer.super_CNetAddr.m_net;
        uStack_134 = local_90.peer.super_CNetAddr.m_scope_id;
        local_130 = local_90.peer.port;
        prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                  ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_128.indirect_contents,
                   (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_150.indirect_contents)
        ;
        local_110 = local_138;
        uStack_10c = uStack_134;
        local_108 = local_130;
        local_100 = 100000000;
        local_f8 = 0;
        CreateNodeFromAcceptedSocket
                  (this,&local_90.sock,None,(CAddress *)&local_c8.indirect_contents,
                   (CAddress *)&local_128.indirect_contents);
        if (0x10 < local_118) {
          free(local_128.indirect_contents.indirect);
          local_128.indirect_contents.indirect = (char *)0x0;
        }
        if (0x10 < local_140) {
          free(local_150.indirect_contents.indirect);
          local_150.indirect_contents.indirect = (char *)0x0;
        }
        if (0x10 < local_b8) {
          free(local_c8.indirect_contents.indirect);
          local_c8.indirect_contents.indirect = (char *)0x0;
        }
        if (0x10 < local_e0) {
          free(local_f0.indirect_contents.indirect);
          local_f0.indirect_contents.indirect = (char *)0x0;
        }
        lVar3 = 1;
        goto LAB_008df27c;
      }
      CThreadInterrupt::sleep_for(this_01,(duration)(lVar3 * 1000000000));
    }
    else {
      if (bVar1) {
        bVar2 = CNetAddr::IsValid(&this_00->super_CNetAddr);
        if (bVar2) {
          RemoveLocal(this_00);
          bVar1 = false;
        }
      }
      CThreadInterrupt::sleep_for(this_01,(duration)(lVar3 * 1000000000));
    }
    lVar3 = lVar3 + (ulong)(lVar3 < 300);
  } while( true );
}

Assistant:

void CConnman::ThreadI2PAcceptIncoming()
{
    static constexpr auto err_wait_begin = 1s;
    static constexpr auto err_wait_cap = 5min;
    auto err_wait = err_wait_begin;

    bool advertising_listen_addr = false;
    i2p::Connection conn;

    auto SleepOnFailure = [&]() {
        interruptNet.sleep_for(err_wait);
        if (err_wait < err_wait_cap) {
            err_wait += 1s;
        }
    };

    while (!interruptNet) {

        if (!m_i2p_sam_session->Listen(conn)) {
            if (advertising_listen_addr && conn.me.IsValid()) {
                RemoveLocal(conn.me);
                advertising_listen_addr = false;
            }
            SleepOnFailure();
            continue;
        }

        if (!advertising_listen_addr) {
            AddLocal(conn.me, LOCAL_MANUAL);
            advertising_listen_addr = true;
        }

        if (!m_i2p_sam_session->Accept(conn)) {
            SleepOnFailure();
            continue;
        }

        CreateNodeFromAcceptedSocket(std::move(conn.sock), NetPermissionFlags::None,
                                     CAddress{conn.me, NODE_NONE}, CAddress{conn.peer, NODE_NONE});

        err_wait = err_wait_begin;
    }
}